

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_eol
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte bVar2;
  char_t *pcVar3;
  byte *local_50;
  gap g;
  
  g.end = (char_t *)0x0;
  g.size = 0;
  do {
    while (bVar2 = *s, ((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
LAB_001a65df:
      local_50 = (byte *)s;
      if (bVar2 == end_quote) {
        pcVar3 = gap::flush(&g,s);
        *pcVar3 = '\0';
        return (char_t *)((byte *)s + 1);
      }
      if (bVar2 == 0xd) {
        local_50 = (byte *)s + 1;
        *s = 10;
        pbVar1 = (byte *)s + 1;
        s = (char_t *)local_50;
        if (*pbVar1 == 10) {
          gap::push(&g,(char_t **)&local_50,1);
          s = (char_t *)local_50;
        }
      }
      else if (bVar2 == 0x26) {
        s = strconv_escape(s,&g);
      }
      else {
        if (bVar2 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)((byte *)s + 1);
      }
    }
    bVar2 = ((byte *)s)[1];
    if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
      s = (char_t *)((byte *)s + 1);
      goto LAB_001a65df;
    }
    bVar2 = ((byte *)s)[2];
    if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
      s = (char_t *)((byte *)s + 2);
      goto LAB_001a65df;
    }
    bVar2 = ((byte *)s)[3];
    if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
      s = (char_t *)((byte *)s + 3);
      goto LAB_001a65df;
    }
    s = (char_t *)((byte *)s + 4);
  } while( true );
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}